

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::replacePhiOption
          (mocker *this,shared_ptr<mocker::ir::Phi> *phi,size_t oldLabel,size_t newLabel)

{
  bool bVar1;
  element_type *peVar2;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *pvVar3;
  reference __x;
  element_type *peVar4;
  size_t sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::IRInst> sVar6;
  pointer local_e8;
  shared_ptr<mocker::ir::Phi> local_b8;
  pointer local_a8;
  shared_ptr<mocker::ir::Label> local_a0;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> local_90;
  reference local_70;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range1;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  newOptions;
  size_t newLabel_local;
  size_t oldLabel_local;
  shared_ptr<mocker::ir::Phi> *phi_local;
  
  newOptions.
  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)newLabel;
  std::
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  ::vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            *)&__range1);
  peVar2 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)phi);
  pvVar3 = ir::Phi::getOptions(peVar2);
  __end1 = std::
           vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
           ::begin(pvVar3);
  option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
           std::
           vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
           ::end(pvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                *)&option);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
          ::operator*(&__end1);
    local_70 = __x;
    peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&__x->second);
    sVar5 = ir::Label::getID(peVar4);
    if (sVar5 == oldLabel) {
      local_e8 = newOptions.
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_70->second);
      local_e8 = (pointer)ir::Label::getID(peVar4);
    }
    local_a8 = local_e8;
    std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&local_a0);
    std::make_pair<std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>>
              (&local_90,&__x->first,&local_a0);
    std::
    vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
    ::emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
              ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                *)&__range1,&local_90);
    std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>::~pair
              (&local_90);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
    ::operator++(&__end1);
  }
  peVar2 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)phi);
  pvVar3 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            *)ir::Definition::getDest(&peVar2->super_Definition);
  std::
  make_shared<mocker::ir::Phi,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
            ((shared_ptr<mocker::ir::Reg> *)&local_b8,pvVar3);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Phi,void>
            ((shared_ptr<mocker::ir::IRInst> *)this,&local_b8);
  std::shared_ptr<mocker::ir::Phi>::~shared_ptr(&local_b8);
  std::
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
             *)&__range1);
  sVar6.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar6.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ir::IRInst>
replacePhiOption(const std::shared_ptr<ir::Phi> &phi, std::size_t oldLabel,
                 std::size_t newLabel) {
  std::vector<ir::Phi::Option> newOptions;
  for (auto &option : phi->getOptions()) {
    newOptions.emplace_back(std::make_pair(
        option.first,
        std::make_shared<ir::Label>(option.second->getID() == oldLabel
                                        ? newLabel
                                        : option.second->getID())));
  }
  return std::make_shared<ir::Phi>(phi->getDest(), std::move(newOptions));
}